

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O2

void __thiscall Saturation::ConsequenceFinder::onAllProcessed(ConsequenceFinder *this)

{
  uint uVar1;
  uint *puVar2;
  SkipList<Kernel::Clause_*,_Lib::Int> *this_00;
  SkipList<Kernel::Clause_*,_Lib::Int> **ppSVar3;
  Clause *cl;
  
  while (puVar2 = (this->_redundantsToHandle)._cursor, puVar2 != (this->_redundantsToHandle)._stack)
  {
    (this->_redundantsToHandle)._cursor = puVar2 + -1;
    uVar1 = puVar2[-1];
    ppSVar3 = Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::operator[]
                        (&(this->_index).super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>,
                         (ulong)uVar1);
    this_00 = *ppSVar3;
    if (this_00 != (SkipList<Kernel::Clause_*,_Lib::Int> *)0x0) {
      ppSVar3 = Lib::Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>::operator[]
                          (&(this->_index).super_Array<Lib::SkipList<Kernel::Clause_*,_Lib::Int>_*>,
                           (ulong)uVar1);
      *ppSVar3 = (SkipList<Kernel::Clause_*,_Lib::Int> *)0x0;
      while (this_00->_left->nodes[0] != (Node *)0x0) {
        cl = Lib::SkipList<Kernel::Clause_*,_Lib::Int>::pop(this_00);
        if ((cl->field_0x3b & 0xe) == 0) {
          SaturationAlgorithm::removeActiveOrPassiveClause(this->_sa,cl);
        }
      }
      Lib::SkipList<Kernel::Clause_*,_Lib::Int>::~SkipList(this_00);
      Lib::SkipList<Kernel::Clause*,Lib::Int>::operator_delete(this_00,0x10);
    }
  }
  return;
}

Assistant:

void ConsequenceFinder::onAllProcessed()
{
  TIME_TRACE(TimeTrace::CONSEQUENCE_FINDING);

  while(_redundantsToHandle.isNonEmpty()) {
    unsigned red=_redundantsToHandle.pop();

    ClauseSL* rlist=_index[red];
    if(rlist) {
      _index[red]=0;
      while(rlist->isNonEmpty()) {
        Clause* rcl=rlist->pop();
        // Martin: there was comma in an if-statement -- Highly suspicious!
        // This has the same effect and doesn't trigger a warning, but should be revised when this code is understood.
        (void)(rcl->store()!=Clause::UNPROCESSED && rcl->store()!=Clause::NONE);
        if(rcl->store()) {
          //this case is not very likely to happen, but possible -- one clause is redundant
          //both due to the consequence-finding mode and to some backward simplification
          continue;
        }
        _sa->removeActiveOrPassiveClause(rcl);
      }
      delete rlist;
    }
  }
}